

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

string * __thiscall
ExceptionFreeserf::get_description_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionFreeserf *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (**(code **)(*(long *)this + 0x20))(&local_38);
  std::operator+(&bStack_78,"[",&local_38);
  std::operator+(&local_58,&bStack_78,"] ");
  std::operator+(__return_storage_ptr__,&local_58,&this->description);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
ExceptionFreeserf::get_description() const {
  return "[" + get_system() + "] " + description;
}